

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsmn.h
# Opt level: O3

int jsmn_parse(jsmn_parser *parser,char *js,size_t len,jsmntok_t *tokens,uint num_tokens)

{
  byte bVar1;
  char cVar2;
  bool bVar3;
  uint uVar4;
  int *piVar5;
  long lVar6;
  long lVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  ulong uVar12;
  uint uVar14;
  int iVar15;
  uint uVar16;
  uint uVar17;
  uint uVar18;
  ulong uVar13;
  
  uVar8 = parser->pos;
  uVar18 = parser->toknext;
  uVar10 = uVar18;
  uVar4 = uVar18;
  uVar9 = uVar18;
joined_r0x0010f415:
  uVar13 = (ulong)uVar8;
  if (uVar13 < len) {
    bVar1 = js[uVar13];
    if (0x2b < bVar1) {
      if (bVar1 < 0x5d) {
        if (bVar1 == 0x2c) {
          if ((((tokens != (jsmntok_t *)0x0) && ((long)parser->toksuper != -1)) &&
              (1 < tokens[parser->toksuper].type - JSMN_OBJECT)) &&
             (uVar11 = uVar10 - 1, -1 < (int)uVar11)) {
            piVar5 = &tokens[uVar11].end;
            uVar13 = (ulong)uVar11;
            do {
              if (((((jsmntok_t *)(piVar5 + -2))->type - JSMN_OBJECT < 2) && (piVar5[-1] != -1)) &&
                 (*piVar5 == -1)) {
                parser->toksuper = (int)uVar13;
                break;
              }
              piVar5 = piVar5 + -4;
              bVar3 = 0 < (long)uVar13;
              uVar13 = uVar13 - 1;
            } while (bVar3);
          }
        }
        else if (bVar1 == 0x3a) {
          parser->toksuper = uVar18 - 1;
          uVar10 = uVar18;
        }
        else {
          if (bVar1 != 0x5b) goto LAB_0010f5b5;
LAB_0010f658:
          uVar4 = uVar4 + 1;
          if (tokens != (jsmntok_t *)0x0) {
            if (num_tokens <= uVar9) {
              return -1;
            }
            uVar18 = uVar9 + 1;
            parser->toknext = uVar18;
            tokens[uVar9].end = -1;
            tokens[uVar9].size = 0;
            if ((long)parser->toksuper != -1) {
              tokens[parser->toksuper].size = tokens[parser->toksuper].size + 1;
            }
            tokens[uVar9].type = (bVar1 != 0x7b) + JSMN_OBJECT;
            tokens[uVar9].start = uVar8;
            parser->toksuper = uVar9;
            uVar10 = uVar18;
            uVar9 = uVar18;
          }
        }
      }
      else {
        if (bVar1 != 0x5d) {
          if (bVar1 == 0x7b) goto LAB_0010f658;
          if (bVar1 != 0x7d) goto LAB_0010f5b5;
        }
        if (tokens != (jsmntok_t *)0x0) {
          uVar11 = uVar9 - 1;
          if ((int)uVar11 < 0) {
            uVar13 = (ulong)uVar9;
          }
          else {
            piVar5 = &tokens[uVar11].end;
            uVar13 = (ulong)uVar11 + 1;
            while ((piVar5[-1] == -1 || (*piVar5 != -1))) {
              piVar5 = piVar5 + -4;
              uVar12 = uVar13 - 1;
              bVar3 = (long)uVar13 < 1;
              uVar13 = uVar12;
              if (uVar12 == 0 || bVar3) {
                return -2;
              }
            }
            if (((jsmntok_t *)(piVar5 + -2))->type != (bVar1 != 0x7d) + JSMN_OBJECT) {
              return -2;
            }
            uVar11 = (int)uVar13 - 1;
            parser->toksuper = -1;
            *piVar5 = uVar8 + 1;
          }
          if ((int)uVar13 == 0) {
            return -2;
          }
          uVar18 = uVar9;
          uVar10 = uVar9;
          if (-1 < (int)uVar11) {
            piVar5 = &tokens[uVar11].end;
            uVar13 = (ulong)uVar11;
            do {
              if ((piVar5[-1] != -1) && (*piVar5 == -1)) {
                parser->toksuper = (int)uVar13;
                break;
              }
              piVar5 = piVar5 + -4;
              bVar3 = 0 < (long)uVar13;
              uVar13 = uVar13 - 1;
            } while (bVar3);
          }
        }
      }
      goto LAB_0010f83a;
    }
    if (0xc < bVar1) {
      if ((bVar1 != 0xd) && (bVar1 != 0x20)) {
        if (bVar1 == 0x22) {
          uVar11 = uVar8 + 1;
          parser->pos = uVar11;
          if (uVar11 < len) {
            uVar13 = (ulong)uVar11;
            do {
              uVar16 = (uint)uVar13;
              cVar2 = js[uVar13];
              if (cVar2 == '\\') {
                uVar17 = uVar16 + 1;
                if (uVar17 < len) {
                  parser->pos = uVar17;
                  uVar14 = (byte)js[uVar17] - 0x62;
                  uVar16 = uVar17;
                  if ((0x12 < uVar14) || ((0x51011U >> (uVar14 & 0x1f) & 1) == 0)) {
                    iVar15 = -2;
                    uVar17 = (byte)js[uVar17] - 0x22;
                    if ((0x3a < uVar17) || ((0x400000000002001U >> ((ulong)uVar17 & 0x3f) & 1) == 0)
                       ) goto LAB_0010f88e;
                  }
                }
              }
              else {
                if (cVar2 == '\0') break;
                if (cVar2 == '\"') goto LAB_0010f7be;
              }
              uVar13 = (ulong)(uVar16 + 1);
              parser->pos = uVar16 + 1;
              if (len <= uVar13) break;
            } while( true );
          }
          iVar15 = -3;
          goto LAB_0010f88e;
        }
        goto LAB_0010f5b5;
      }
      goto LAB_0010f83a;
    }
    if (bVar1 - 9 < 2) goto LAB_0010f83a;
    if (bVar1 != 0) {
LAB_0010f5b5:
      do {
        uVar11 = (uint)uVar13;
        bVar1 = js[uVar13];
        if (((((ulong)bVar1 < 0x3b) && ((0x400100100002601U >> ((ulong)bVar1 & 0x3f) & 1) != 0)) ||
            (bVar1 == 0x5d)) || (bVar1 == 0x7d)) break;
        if ((byte)(bVar1 + 0x81) < 0xa1) {
          iVar15 = -2;
          goto LAB_0010f88e;
        }
        uVar11 = uVar11 + 1;
        uVar13 = (ulong)uVar11;
        parser->pos = uVar11;
      } while (uVar13 < len);
      if (tokens == (jsmntok_t *)0x0) {
LAB_0010f75d:
        uVar4 = uVar4 + 1;
        uVar8 = uVar11 - 1;
        goto LAB_0010f83a;
      }
      if (uVar9 < num_tokens) {
        uVar18 = uVar9 + 1;
        parser->toknext = uVar18;
        tokens[uVar9].type = JSMN_PRIMITIVE;
        tokens[uVar9].start = uVar8;
        tokens[uVar9].end = uVar11;
        tokens[uVar9].size = 0;
        uVar10 = uVar18;
        uVar9 = uVar18;
        if ((long)parser->toksuper != -1) {
          tokens[parser->toksuper].size = tokens[parser->toksuper].size + 1;
        }
        goto LAB_0010f75d;
      }
      goto LAB_0010f8c0;
    }
  }
  if ((tokens != (jsmntok_t *)0x0) && (uVar9 = uVar9 - 1, -1 < (int)uVar9)) {
    piVar5 = &tokens[uVar9].end;
    lVar6 = (ulong)uVar9 + 1;
    do {
      if ((piVar5[-1] != -1) && (*piVar5 == -1)) {
        return -3;
      }
      piVar5 = piVar5 + -4;
      lVar7 = lVar6 + -1;
      bVar3 = 0 < lVar6;
      lVar6 = lVar7;
    } while (lVar7 != 0 && bVar3);
  }
  return uVar4;
LAB_0010f7be:
  uVar17 = uVar18;
  if (tokens != (jsmntok_t *)0x0) {
    if (num_tokens <= uVar18) {
LAB_0010f8c0:
      iVar15 = -1;
LAB_0010f88e:
      parser->pos = uVar8;
      return iVar15;
    }
    uVar17 = uVar18 + 1;
    parser->toknext = uVar17;
    tokens[uVar18].type = JSMN_STRING;
    tokens[uVar18].start = uVar11;
    tokens[uVar18].end = uVar16;
    tokens[uVar18].size = 0;
    uVar10 = uVar17;
    uVar9 = uVar17;
    if ((long)parser->toksuper != -1) {
      tokens[parser->toksuper].size = tokens[parser->toksuper].size + 1;
    }
  }
  uVar4 = uVar4 + 1;
  uVar18 = uVar17;
  uVar8 = uVar16;
LAB_0010f83a:
  uVar8 = uVar8 + 1;
  parser->pos = uVar8;
  goto joined_r0x0010f415;
}

Assistant:

JSMN_API int jsmn_parse(jsmn_parser *parser, const char *js, const size_t len,
                        jsmntok_t *tokens, const unsigned int num_tokens) {
  int r;
  int i;
  jsmntok_t *token;
  int count = parser->toknext;

  for (; parser->pos < len && js[parser->pos] != '\0'; parser->pos++) {
    char c;
    jsmntype_t type;

    c = js[parser->pos];
    switch (c) {
    case '{':
    case '[':
      count++;
      if (tokens == NULL) {
        break;
      }
      token = jsmn_alloc_token(parser, tokens, num_tokens);
      if (token == NULL) {
        return JSMN_ERROR_NOMEM;
      }
      if (parser->toksuper != -1) {
        jsmntok_t *t = &tokens[parser->toksuper];
#ifdef JSMN_STRICT
        /* In strict mode an object or array can't become a key */
        if (t->type == JSMN_OBJECT) {
          return JSMN_ERROR_INVAL;
        }
#endif
        t->size++;
#ifdef JSMN_PARENT_LINKS
        token->parent = parser->toksuper;
#endif
      }
      token->type = (c == '{' ? JSMN_OBJECT : JSMN_ARRAY);
      token->start = parser->pos;
      parser->toksuper = parser->toknext - 1;
      break;
    case '}':
    case ']':
      if (tokens == NULL) {
        break;
      }
      type = (c == '}' ? JSMN_OBJECT : JSMN_ARRAY);
#ifdef JSMN_PARENT_LINKS
      if (parser->toknext < 1) {
        return JSMN_ERROR_INVAL;
      }
      token = &tokens[parser->toknext - 1];
      for (;;) {
        if (token->start != -1 && token->end == -1) {
          if (token->type != type) {
            return JSMN_ERROR_INVAL;
          }
          token->end = parser->pos + 1;
          parser->toksuper = token->parent;
          break;
        }
        if (token->parent == -1) {
          if (token->type != type || parser->toksuper == -1) {
            return JSMN_ERROR_INVAL;
          }
          break;
        }
        token = &tokens[token->parent];
      }
#else
      for (i = parser->toknext - 1; i >= 0; i--) {
        token = &tokens[i];
        if (token->start != -1 && token->end == -1) {
          if (token->type != type) {
            return JSMN_ERROR_INVAL;
          }
          parser->toksuper = -1;
          token->end = parser->pos + 1;
          break;
        }
      }
      /* Error if unmatched closing bracket */
      if (i == -1) {
        return JSMN_ERROR_INVAL;
      }
      for (; i >= 0; i--) {
        token = &tokens[i];
        if (token->start != -1 && token->end == -1) {
          parser->toksuper = i;
          break;
        }
      }
#endif
      break;
    case '\"':
      r = jsmn_parse_string(parser, js, len, tokens, num_tokens);
      if (r < 0) {
        return r;
      }
      count++;
      if (parser->toksuper != -1 && tokens != NULL) {
        tokens[parser->toksuper].size++;
      }
      break;
    case '\t':
    case '\r':
    case '\n':
    case ' ':
      break;
    case ':':
      parser->toksuper = parser->toknext - 1;
      break;
    case ',':
      if (tokens != NULL && parser->toksuper != -1 &&
          tokens[parser->toksuper].type != JSMN_ARRAY &&
          tokens[parser->toksuper].type != JSMN_OBJECT) {
#ifdef JSMN_PARENT_LINKS
        parser->toksuper = tokens[parser->toksuper].parent;
#else
        for (i = parser->toknext - 1; i >= 0; i--) {
          if (tokens[i].type == JSMN_ARRAY || tokens[i].type == JSMN_OBJECT) {
            if (tokens[i].start != -1 && tokens[i].end == -1) {
              parser->toksuper = i;
              break;
            }
          }
        }
#endif
      }
      break;
#ifdef JSMN_STRICT
    /* In strict mode primitives are: numbers and booleans */
    case '-':
    case '0':
    case '1':
    case '2':
    case '3':
    case '4':
    case '5':
    case '6':
    case '7':
    case '8':
    case '9':
    case 't':
    case 'f':
    case 'n':
      /* And they must not be keys of the object */
      if (tokens != NULL && parser->toksuper != -1) {
        const jsmntok_t *t = &tokens[parser->toksuper];
        if (t->type == JSMN_OBJECT ||
            (t->type == JSMN_STRING && t->size != 0)) {
          return JSMN_ERROR_INVAL;
        }
      }
#else
    /* In non-strict mode every unquoted value is a primitive */
    default:
#endif
      r = jsmn_parse_primitive(parser, js, len, tokens, num_tokens);
      if (r < 0) {
        return r;
      }
      count++;
      if (parser->toksuper != -1 && tokens != NULL) {
        tokens[parser->toksuper].size++;
      }
      break;

#ifdef JSMN_STRICT
    /* Unexpected char in strict mode */
    default:
      return JSMN_ERROR_INVAL;
#endif
    }
  }

  if (tokens != NULL) {
    for (i = parser->toknext - 1; i >= 0; i--) {
      /* Unmatched opened object or array */
      if (tokens[i].start != -1 && tokens[i].end == -1) {
        return JSMN_ERROR_PART;
      }
    }
  }

  return count;
}